

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ParseAndMergePartial
               (CodedInputStream *input,Message *message)

{
  bool bVar1;
  uint32 tag_00;
  WireType WVar2;
  int iVar3;
  Descriptor *this;
  DescriptorPool *pDVar4;
  CodedInputStream *in_RDI;
  uint32 unaff_retaddr;
  CodedInputStream *in_stack_00000008;
  int field_number;
  FieldDescriptor *field;
  uint32 tag;
  Reflection *message_reflection;
  Descriptor *descriptor;
  uint32 v;
  CodedInputStream *in_stack_000002b8;
  Message *in_stack_000002c0;
  FieldDescriptor *in_stack_000002c8;
  uint32 in_stack_000002d4;
  int in_stack_ffffffffffffff8c;
  Message *in_stack_ffffffffffffff90;
  CodedInputStream *pCVar5;
  int number;
  CodedInputStream *pCVar6;
  undefined4 in_stack_ffffffffffffffa0;
  FieldDescriptor *local_58;
  uint32 number_00;
  CodedInputStream *pCVar7;
  undefined4 in_stack_fffffffffffffff8;
  uint32 uVar8;
  
  this = Message::GetDescriptor(in_stack_ffffffffffffff90);
  Message::GetReflection(in_stack_ffffffffffffff90);
  do {
    while( true ) {
      pCVar5 = in_RDI;
      pCVar6 = in_RDI;
      pCVar7 = in_RDI;
      if ((in_RDI->buffer_ < in_RDI->buffer_end_) &&
         (tag_00 = (uint32)*in_RDI->buffer_, tag_00 < 0x80)) {
        io::CodedInputStream::Advance(in_RDI,1);
      }
      else {
        tag_00 = io::CodedInputStream::ReadTagFallback(in_stack_00000008,unaff_retaddr);
      }
      pCVar5->last_tag_ = tag_00;
      if (tag_00 == 0) {
        return true;
      }
      number_00 = tag_00;
      uVar8 = tag_00;
      WVar2 = WireFormatLite::GetTagWireType(tag_00);
      if (WVar2 == WIRETYPE_END_GROUP) {
        return true;
      }
      if (this != (Descriptor *)0x0) break;
LAB_00466b7e:
      bVar1 = ParseAndMergeField(in_stack_000002d4,in_stack_000002c8,in_stack_000002c0,
                                 in_stack_000002b8);
      if (!bVar1) {
        return false;
      }
    }
    iVar3 = WireFormatLite::GetTagFieldNumber(tag_00);
    local_58 = Descriptor::FindFieldByNumber((Descriptor *)pCVar6,(int)((ulong)pCVar5 >> 0x20));
    if (local_58 == (FieldDescriptor *)0x0) {
      bVar1 = Descriptor::IsExtensionNumber((Descriptor *)pCVar5,in_stack_ffffffffffffff8c);
      number = (int)((ulong)pCVar5 >> 0x20);
      if (bVar1) {
        pDVar4 = io::CodedInputStream::GetExtensionPool(in_RDI);
        if (pDVar4 == (DescriptorPool *)0x0) {
          local_58 = Reflection::FindKnownExtensionByNumber((Reflection *)pCVar6,number);
        }
        else {
          io::CodedInputStream::GetExtensionPool(in_RDI);
          local_58 = DescriptorPool::FindExtensionByNumber
                               ((DescriptorPool *)CONCAT44(uVar8,in_stack_fffffffffffffff8),
                                (Descriptor *)pCVar7,number_00);
        }
      }
    }
    if (local_58 != (FieldDescriptor *)0x0) goto LAB_00466b7e;
    Descriptor::options(this);
    bVar1 = MessageOptions::message_set_wire_format((MessageOptions *)0x466b50);
    if ((!bVar1) || (tag_00 != 0xb)) goto LAB_00466b7e;
    bVar1 = ParseAndMergeMessageSetItem
                      ((CodedInputStream *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),
                       (Message *)pCVar6);
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergePartial(io::CodedInputStream* input,
                                      Message* message) {
  const Descriptor* descriptor = message->GetDescriptor();
  const Reflection* message_reflection = message->GetReflection();

  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    if (WireFormatLite::GetTagWireType(tag) ==
        WireFormatLite::WIRETYPE_END_GROUP) {
      // Must be the end of the message.
      return true;
    }

    const FieldDescriptor* field = NULL;

    if (descriptor != NULL) {
      int field_number = WireFormatLite::GetTagFieldNumber(tag);
      field = descriptor->FindFieldByNumber(field_number);

      // If that failed, check if the field is an extension.
      if (field == NULL && descriptor->IsExtensionNumber(field_number)) {
        if (input->GetExtensionPool() == NULL) {
          field = message_reflection->FindKnownExtensionByNumber(field_number);
        } else {
          field = input->GetExtensionPool()->FindExtensionByNumber(
              descriptor, field_number);
        }
      }

      // If that failed, but we're a MessageSet, and this is the tag for a
      // MessageSet item, then parse that.
      if (field == NULL && descriptor->options().message_set_wire_format() &&
          tag == WireFormatLite::kMessageSetItemStartTag) {
        if (!ParseAndMergeMessageSetItem(input, message)) {
          return false;
        }
        continue;  // Skip ParseAndMergeField(); already taken care of.
      }
    }

    if (!ParseAndMergeField(tag, field, message, input)) {
      return false;
    }
  }
}